

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmExportCommand.cxx
# Opt level: O2

bool __thiscall
cmExportCommand::InitialPass
          (cmExportCommand *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *args,cmExecutionStatus *param_2)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__lhs;
  bool bVar1;
  ostream *poVar2;
  char *pcVar3;
  cmGlobalGenerator *this_00;
  cmTarget *pcVar4;
  iterator iVar5;
  cmExportSet *pcVar6;
  cmExportBuildFileGenerator *pcVar7;
  ostringstream *this_01;
  cmCommandArgument *this_02;
  pointer pbVar8;
  _Rb_tree_header *p_Var9;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  configurationTypes;
  string fname;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_228;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  targets;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  unknownArgs;
  ostringstream e;
  string local_50;
  
  this_01 = (ostringstream *)&configurationTypes;
  __lhs = (args->
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          )._M_impl.super__Vector_impl_data._M_start;
  if ((ulong)((long)(args->
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    )._M_impl.super__Vector_impl_data._M_finish - (long)__lhs) < 0x21) {
    std::__cxx11::string::string((string *)&e,"called with too few arguments",(allocator *)&fname);
    cmCommand::SetError(&this->super_cmCommand,(string *)&e);
    std::__cxx11::string::~string((string *)&e);
    return false;
  }
  bVar1 = std::operator==(__lhs,"PACKAGE");
  if (bVar1) {
    bVar1 = HandlePackage(this,args);
    return bVar1;
  }
  bVar1 = std::operator==((args->
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          )._M_impl.super__Vector_impl_data._M_start,"EXPORT");
  this_02 = &(this->ExportSetName).super_cmCommandArgument;
  if (!bVar1) {
    this_02 = &(this->Targets).super_cmCommandArgument;
  }
  cmCommandArgument::Follows(this_02,(cmCommandArgument *)0x0);
  cmCommandArgumentGroup::Follows(&this->ArgumentGroup,this_02);
  unknownArgs.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  unknownArgs.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  unknownArgs.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  cmCommandArgumentsHelper::Parse(&(this->super_cmCommand).Helper,args,&unknownArgs);
  if (unknownArgs.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      unknownArgs.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    std::__cxx11::string::string((string *)&e,"Unknown arguments.",(allocator *)&fname);
    cmCommand::SetError(&this->super_cmCommand,(string *)&e);
    std::__cxx11::string::~string((string *)&e);
    bVar1 = false;
    goto LAB_003d97d4;
  }
  fname._M_dataplus._M_p = (pointer)&fname.field_2;
  fname._M_string_length = 0;
  fname.field_2._M_local_buf[0] = '\0';
  if ((this->Filename).super_cmCommandArgument.WasActive == false) {
    bVar1 = std::operator!=((args->
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            )._M_impl.super__Vector_impl_data._M_start,"EXPORT");
    if (!bVar1) {
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&e,
                     &(this->ExportSetName).String,".cmake");
      std::__cxx11::string::operator=((string *)&fname,(string *)&e);
      std::__cxx11::string::~string((string *)&e);
      goto LAB_003d9392;
    }
    std::__cxx11::string::string
              ((string *)&e,"FILE <filename> option missing.",(allocator *)&configurationTypes);
    cmCommand::SetError(&this->super_cmCommand,(string *)&e);
    std::__cxx11::string::~string((string *)&e);
LAB_003d9427:
    bVar1 = false;
  }
  else {
    std::__cxx11::string::string
              ((string *)&configurationTypes,(this->Filename).String._M_dataplus._M_p,
               (allocator *)&local_228);
    cmsys::SystemTools::GetFilenameLastExtension((string *)&e,(string *)&configurationTypes);
    bVar1 = std::operator!=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&e,
                            ".cmake");
    std::__cxx11::string::~string((string *)&e);
    std::__cxx11::string::~string((string *)&configurationTypes);
    if (bVar1) {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&e);
      poVar2 = std::operator<<((ostream *)&e,"FILE option given filename \"");
      poVar2 = std::operator<<(poVar2,(string *)&(this->Filename).String);
      std::operator<<(poVar2,"\" which does not have an extension of \".cmake\".\n");
      std::__cxx11::stringbuf::str();
      cmCommand::SetError(&this->super_cmCommand,(string *)&configurationTypes);
LAB_003d9412:
      std::__cxx11::string::~string((string *)&configurationTypes);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)&e);
      goto LAB_003d9427;
    }
    std::__cxx11::string::_M_assign((string *)&fname);
LAB_003d9392:
    bVar1 = cmsys::SystemTools::FileIsFullPath(fname._M_dataplus._M_p);
    if (bVar1) {
      bVar1 = cmMakefile::CanIWriteThisFile((this->super_cmCommand).Makefile,fname._M_dataplus._M_p)
      ;
      if (!bVar1) {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)&e);
        poVar2 = std::operator<<((ostream *)&e,"FILE option given filename \"");
        poVar2 = std::operator<<(poVar2,(string *)&fname);
        std::operator<<(poVar2,"\" which is in the source tree.\n");
        std::__cxx11::stringbuf::str();
        cmCommand::SetError(&this->super_cmCommand,(string *)&configurationTypes);
        goto LAB_003d9412;
      }
    }
    else {
      pcVar3 = cmMakefile::GetCurrentBinaryDirectory((this->super_cmCommand).Makefile);
      std::__cxx11::string::string((string *)&e,pcVar3,(allocator *)&configurationTypes);
      std::operator+(&local_228,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&e,"/");
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     &configurationTypes,&local_228,&fname);
      std::__cxx11::string::operator=((string *)&fname,(string *)&configurationTypes);
      std::__cxx11::string::~string((string *)&configurationTypes);
      std::__cxx11::string::~string((string *)&local_228);
      std::__cxx11::string::~string((string *)&e);
    }
    targets.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    targets.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    targets.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    this_00 = cmMakefile::GetGlobalGenerator((this->super_cmCommand).Makefile);
    bVar1 = std::operator==((args->
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            )._M_impl.super__Vector_impl_data._M_start,"EXPORT");
    if (bVar1) {
      if ((this->Append).Enabled == true) {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)&e);
        std::operator<<((ostream *)&e,"EXPORT signature does not recognise the APPEND option.");
        std::__cxx11::stringbuf::str();
        cmCommand::SetError(&this->super_cmCommand,(string *)&configurationTypes);
      }
      else {
        if ((this->ExportOld).Enabled != true) {
          std::__cxx11::string::string
                    ((string *)&configurationTypes,(string *)&(this->ExportSetName).String);
          iVar5 = std::
                  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmExportSet_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmExportSet_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmExportSet_*>_>_>
                  ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmExportSet_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmExportSet_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmExportSet_*>_>_>
                          *)&this_00->ExportSets,(key_type *)&configurationTypes);
          p_Var9 = &(this_00->ExportSets).
                    super_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmExportSet_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmExportSet_*>_>_>
                    ._M_t._M_impl.super__Rb_tree_header;
          if ((_Rb_tree_header *)iVar5._M_node == p_Var9) {
            std::__cxx11::ostringstream::ostringstream((ostringstream *)&e);
            poVar2 = std::operator<<((ostream *)&e,"Export set \"");
            poVar2 = std::operator<<(poVar2,(string *)&configurationTypes);
            std::operator<<(poVar2,"\" not found.");
            std::__cxx11::stringbuf::str();
            cmCommand::SetError(&this->super_cmCommand,&local_228);
            std::__cxx11::string::~string((string *)&local_228);
            std::__cxx11::ostringstream::~ostringstream((ostringstream *)&e);
          }
          else {
            pcVar6 = cmExportSetMap::operator[](&this_00->ExportSets,(string *)&configurationTypes);
            this->ExportSet = pcVar6;
          }
          std::__cxx11::string::~string((string *)&configurationTypes);
          if ((_Rb_tree_header *)iVar5._M_node != p_Var9) goto LAB_003d98c5;
          goto LAB_003d97be;
        }
        std::__cxx11::ostringstream::ostringstream((ostringstream *)&e);
        std::operator<<((ostream *)&e,
                        "EXPORT signature does not recognise the EXPORT_LINK_INTERFACE_LIBRARIES option."
                       );
        std::__cxx11::stringbuf::str();
        cmCommand::SetError(&this->super_cmCommand,(string *)&configurationTypes);
      }
LAB_003d97a9:
      std::__cxx11::string::~string((string *)&configurationTypes);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)&e);
LAB_003d97be:
      bVar1 = false;
    }
    else {
      if ((this->Targets).super_cmCommandArgument.WasActive != true) {
        std::__cxx11::string::string
                  ((string *)&e,"EXPORT or TARGETS specifier missing.",
                   (allocator *)&configurationTypes);
        cmCommand::SetError(&this->super_cmCommand,(string *)&e);
        this_01 = &e;
LAB_003d9611:
        std::__cxx11::string::~string((string *)this_01);
        goto LAB_003d97be;
      }
      for (pbVar8 = (this->Targets).Vector.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          pbVar8 != (this->Targets).Vector.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish; pbVar8 = pbVar8 + 1) {
        bVar1 = cmMakefile::IsAlias((this->super_cmCommand).Makefile,pbVar8);
        if (bVar1) {
          std::__cxx11::ostringstream::ostringstream((ostringstream *)&e);
          poVar2 = std::operator<<((ostream *)&e,"given ALIAS target \"");
          poVar2 = std::operator<<(poVar2,(string *)pbVar8);
          std::operator<<(poVar2,"\" which may not be exported.");
          std::__cxx11::stringbuf::str();
          cmCommand::SetError(&this->super_cmCommand,(string *)&configurationTypes);
          goto LAB_003d97a9;
        }
        pcVar4 = cmGlobalGenerator::FindTarget(this_00,pbVar8,false);
        if (pcVar4 == (cmTarget *)0x0) {
          std::__cxx11::ostringstream::ostringstream((ostringstream *)&e);
          poVar2 = std::operator<<((ostream *)&e,"given target \"");
          poVar2 = std::operator<<(poVar2,(string *)pbVar8);
          std::operator<<(poVar2,"\" which is not built by this project.");
          std::__cxx11::stringbuf::str();
          cmCommand::SetError(&this->super_cmCommand,(string *)&configurationTypes);
          goto LAB_003d97a9;
        }
        if (pcVar4->TargetTypeValue == UTILITY) {
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &configurationTypes,"given custom target \"",pbVar8);
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&e,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &configurationTypes,"\" which may not be exported.");
          cmCommand::SetError(&this->super_cmCommand,(string *)&e);
          std::__cxx11::string::~string((string *)&e);
          goto LAB_003d9611;
        }
        if (pcVar4->TargetTypeValue == OBJECT_LIBRARY) {
          std::__cxx11::ostringstream::ostringstream((ostringstream *)&e);
          poVar2 = std::operator<<((ostream *)&e,"given OBJECT library \"");
          poVar2 = std::operator<<(poVar2,(string *)pbVar8);
          std::operator<<(poVar2,"\" which may not be exported.");
          std::__cxx11::stringbuf::str();
          cmCommand::SetError(&this->super_cmCommand,(string *)&configurationTypes);
          goto LAB_003d97a9;
        }
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::push_back(&targets,pbVar8);
      }
      if (((this->Append).Enabled == true) &&
         (pcVar7 = cmGlobalGenerator::GetExportedTargetsFile(this_00,&fname),
         pcVar7 != (cmExportBuildFileGenerator *)0x0)) {
        bVar1 = true;
        cmExportBuildFileGenerator::AppendTargets(pcVar7,&targets);
      }
      else {
LAB_003d98c5:
        pcVar7 = (cmExportBuildFileGenerator *)operator_new(0x140);
        cmExportBuildFileGenerator::cmExportBuildFileGenerator(pcVar7);
        cmExportFileGenerator::SetExportFile((cmExportFileGenerator *)pcVar7,fname._M_dataplus._M_p)
        ;
        std::__cxx11::string::string
                  ((string *)&e,(this->Namespace).String._M_dataplus._M_p,
                   (allocator *)&configurationTypes);
        std::__cxx11::string::_M_assign((string *)&(pcVar7->super_cmExportFileGenerator).Namespace);
        std::__cxx11::string::~string((string *)&e);
        (pcVar7->super_cmExportFileGenerator).AppendMode = (this->Append).Enabled;
        if (this->ExportSet == (cmExportSet *)0x0) {
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::operator=(&pcVar7->Targets,&targets);
        }
        else {
          cmExportBuildFileGenerator::SetExportSet(pcVar7,this->ExportSet);
        }
        cmMakefile::AddExportBuildFileGenerator((this->super_cmCommand).Makefile,pcVar7);
        (pcVar7->super_cmExportFileGenerator).ExportOld = (this->ExportOld).Enabled;
        configurationTypes.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        configurationTypes.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        configurationTypes.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        cmMakefile::GetConfigurations
                  (&local_50,(this->super_cmCommand).Makefile,&configurationTypes,true);
        std::__cxx11::string::~string((string *)&local_50);
        pbVar8 = configurationTypes.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        if (configurationTypes.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start ==
            configurationTypes.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish) {
          std::__cxx11::string::string((string *)&e,"",(allocator *)&local_228);
          std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
          emplace_back<std::__cxx11::string>
                    ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                     &configurationTypes,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&e);
          std::__cxx11::string::~string((string *)&e);
          pbVar8 = configurationTypes.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
        }
        for (; pbVar8 != configurationTypes.
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_finish; pbVar8 = pbVar8 + 1) {
          cmExportFileGenerator::AddConfiguration((cmExportFileGenerator *)pcVar7,pbVar8);
        }
        if (this->ExportSet == (cmExportSet *)0x0) {
          cmGlobalGenerator::AddBuildExportSet(this_00,pcVar7);
        }
        else {
          cmGlobalGenerator::AddBuildExportExportSet(this_00,pcVar7);
        }
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector(&configurationTypes);
        bVar1 = true;
      }
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&targets);
  }
  std::__cxx11::string::~string((string *)&fname);
LAB_003d97d4:
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&unknownArgs);
  return bVar1;
}

Assistant:

bool cmExportCommand
::InitialPass(std::vector<std::string> const& args, cmExecutionStatus &)
{
  if(args.size() < 2 )
    {
    this->SetError("called with too few arguments");
    return false;
    }

  if(args[0] == "PACKAGE")
    {
    return this->HandlePackage(args);
    }
  else if (args[0] == "EXPORT")
    {
    this->ExportSetName.Follows(0);
    this->ArgumentGroup.Follows(&this->ExportSetName);
    }
  else
    {
    this->Targets.Follows(0);
    this->ArgumentGroup.Follows(&this->Targets);
    }

  std::vector<std::string> unknownArgs;
  this->Helper.Parse(&args, &unknownArgs);

  if (!unknownArgs.empty())
    {
    this->SetError("Unknown arguments.");
    return false;
    }

  std::string fname;
  if(!this->Filename.WasFound())
    {
    if (args[0] != "EXPORT")
      {
      this->SetError("FILE <filename> option missing.");
      return false;
      }
    fname = this->ExportSetName.GetString() + ".cmake";
    }
  else
    {
    // Make sure the file has a .cmake extension.
    if(cmSystemTools::GetFilenameLastExtension(this->Filename.GetCString())
      != ".cmake")
      {
      std::ostringstream e;
      e << "FILE option given filename \"" << this->Filename.GetString()
        << "\" which does not have an extension of \".cmake\".\n";
      this->SetError(e.str());
      return false;
      }
    fname = this->Filename.GetString();
    }

  // Get the file to write.
  if(cmSystemTools::FileIsFullPath(fname.c_str()))
    {
    if(!this->Makefile->CanIWriteThisFile(fname.c_str()))
      {
      std::ostringstream e;
      e << "FILE option given filename \"" << fname
        << "\" which is in the source tree.\n";
      this->SetError(e.str());
      return false;
      }
    }
  else
    {
    // Interpret relative paths with respect to the current build dir.
    std::string dir = this->Makefile->GetCurrentBinaryDirectory();
    fname = dir + "/" + fname;
    }

  std::vector<std::string> targets;

  cmGlobalGenerator *gg = this->Makefile->GetGlobalGenerator();

  if(args[0] == "EXPORT")
    {
    if (this->Append.IsEnabled())
      {
      std::ostringstream e;
      e << "EXPORT signature does not recognise the APPEND option.";
      this->SetError(e.str());
      return false;
      }

    if (this->ExportOld.IsEnabled())
      {
      std::ostringstream e;
      e << "EXPORT signature does not recognise the "
        "EXPORT_LINK_INTERFACE_LIBRARIES option.";
      this->SetError(e.str());
      return false;
      }

    cmExportSetMap &setMap = gg->GetExportSets();
    std::string setName = this->ExportSetName.GetString();
    if (setMap.find(setName) == setMap.end())
      {
      std::ostringstream e;
      e << "Export set \"" << setName << "\" not found.";
      this->SetError(e.str());
      return false;
      }
    this->ExportSet = setMap[setName];
    }
  else if (this->Targets.WasFound())
    {
    for(std::vector<std::string>::const_iterator
        currentTarget = this->Targets.GetVector().begin();
        currentTarget != this->Targets.GetVector().end();
        ++currentTarget)
      {
      if (this->Makefile->IsAlias(*currentTarget))
        {
        std::ostringstream e;
        e << "given ALIAS target \"" << *currentTarget
          << "\" which may not be exported.";
        this->SetError(e.str());
        return false;
        }

      if(cmTarget* target = gg->FindTarget(*currentTarget))
        {
        if(target->GetType() == cmState::OBJECT_LIBRARY)
          {
          std::ostringstream e;
          e << "given OBJECT library \"" << *currentTarget
            << "\" which may not be exported.";
          this->SetError(e.str());
          return false;
          }
        if (target->GetType() == cmState::UTILITY)
          {
          this->SetError("given custom target \"" + *currentTarget
                         + "\" which may not be exported.");
          return false;
          }
        }
      else
        {
        std::ostringstream e;
        e << "given target \"" << *currentTarget
          << "\" which is not built by this project.";
        this->SetError(e.str());
        return false;
        }
      targets.push_back(*currentTarget);
      }
    if (this->Append.IsEnabled())
      {
      if (cmExportBuildFileGenerator *ebfg = gg->GetExportedTargetsFile(fname))
        {
        ebfg->AppendTargets(targets);
        return true;
        }
      }
    }
  else
    {
    this->SetError("EXPORT or TARGETS specifier missing.");
    return false;
    }

  // Setup export file generation.
  cmExportBuildFileGenerator *ebfg = new cmExportBuildFileGenerator;
  ebfg->SetExportFile(fname.c_str());
  ebfg->SetNamespace(this->Namespace.GetCString());
  ebfg->SetAppendMode(this->Append.IsEnabled());
  if (this->ExportSet)
    {
    ebfg->SetExportSet(this->ExportSet);
    }
  else
    {
    ebfg->SetTargets(targets);
    }
  this->Makefile->AddExportBuildFileGenerator(ebfg);
  ebfg->SetExportOld(this->ExportOld.IsEnabled());

  // Compute the set of configurations exported.
  std::vector<std::string> configurationTypes;
  this->Makefile->GetConfigurations(configurationTypes);
  if(configurationTypes.empty())
    {
    configurationTypes.push_back("");
    }
  for(std::vector<std::string>::const_iterator
        ci = configurationTypes.begin();
      ci != configurationTypes.end(); ++ci)
    {
    ebfg->AddConfiguration(*ci);
    }
  if (this->ExportSet)
    {
    gg->AddBuildExportExportSet(ebfg);
    }
  else
    {
    gg->AddBuildExportSet(ebfg);
    }

  return true;
}